

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QTabBar::setTabData(QTabBar *this,int index,QVariant *data)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((ulong)(long)index < *(ulong *)(lVar1 + 0x2e8)) {
    lVar1 = *(long *)(*(long *)(lVar1 + 0x2e0) + (long)index * 8);
  }
  else {
    lVar1 = 0;
  }
  if (lVar1 != 0) {
    ::QVariant::operator=((QVariant *)(lVar1 + 0xa8),data);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }